

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O0

string * __thiscall wasm::IString::toString_abi_cxx11_(string *__return_storage_ptr__,IString *this)

{
  const_pointer pvVar1;
  size_type sVar2;
  allocator local_19;
  IString *local_18;
  IString *this_local;
  
  local_18 = this;
  this_local = (IString *)__return_storage_ptr__;
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&this->str);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pvVar1,sVar2,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const { return {str.data(), str.size()}; }